

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O2

string * __thiscall
ast::Unary_expression::to_string_abi_cxx11_(string *__return_storage_ptr__,Unary_expression *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  switch(this->operation) {
  case 0x111:
    (*this->expression->_vptr_Expression[2])(&local_30);
    std::operator+(__return_storage_ptr__,"~",&local_30);
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  case 0x114:
    (*this->expression->_vptr_Expression[2])(&local_30);
    std::operator+(__return_storage_ptr__,"!",&local_30);
    break;
  case 0x117:
    (*this->expression->_vptr_Expression[2])(&local_30);
    std::operator+(__return_storage_ptr__,"+",&local_30);
    break;
  case 0x118:
    (*this->expression->_vptr_Expression[2])(&local_30);
    std::operator+(__return_storage_ptr__,"-",&local_30);
  }
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

string Unary_expression::to_string()
{
	switch (this->operation) {
	case PLUS:
		return "+" + expression->to_string();
	case MINUS:
		return "-" + expression->to_string();
	case TILDE:
		return "~" + expression->to_string();
	case EXCLAMATION:
		return "!" + expression->to_string();
	default:
		return string();
	}
}